

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_counting.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  int aiStack_338 [200];
  
  iVar2 = 0x65;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      std::operator<<((ostream *)&std::cout,"Successfully sorted using counting sort! \n");
      return 0;
    }
    generate_random_arrs(aiStack_338,200);
    counting_sort<int>(aiStack_338,200);
    bVar1 = std::is_sorted<int*>(aiStack_338,(int *)&stack0xffffffffffffffe8);
  } while (bVar1);
  __assert_fail("std::is_sorted(arr, arr + n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_counting.cpp"
                ,0x28,"int main()");
}

Assistant:

int main() {
    int n = 200;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        counting_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using counting sort! \n";
    return 0;
}